

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall sqvector<SQObjectPtr>::~sqvector(sqvector<SQObjectPtr> *this)

{
  SQUnsignedInteger SVar1;
  long lVar2;
  ulong uVar3;
  
  SVar1 = this->_allocated;
  if (SVar1 != 0) {
    if (this->_size != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(this->_vals->super_SQObject)._type + lVar2));
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar3 < this->_size);
      SVar1 = this->_allocated;
    }
    sq_vm_free(this->_vals,SVar1 << 4);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }